

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void print_range_(Integer *me,Integer *LO,Integer *HI,Integer *ndim)

{
  ulong uVar1;
  uint ndim_00;
  int lo [7];
  int hi [7];
  char msg [100];
  int local_c8 [8];
  int local_a8 [8];
  char local_88 [112];
  
  if ((int)*ndim < 8) {
    sprintf(local_88,"%d: array section ",(ulong)(uint)*me);
    ndim_00 = (uint)*ndim;
    if (0 < (int)ndim_00) {
      uVar1 = 0;
      do {
        local_a8[uVar1] = (int)HI[uVar1];
        uVar1 = uVar1 + 1;
      } while ((ndim_00 & 0x7fffffff) != uVar1);
      if (0 < (int)ndim_00) {
        uVar1 = 0;
        do {
          local_c8[uVar1] = (int)LO[uVar1];
          uVar1 = uVar1 + 1;
        } while ((ndim_00 & 0x7fffffff) != uVar1);
      }
    }
    print_range_internal(local_88,ndim_00,local_c8,local_a8,"\n");
    return;
  }
  __assert_fail("(int)*ndim <= GA_MAX_DIM",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,0x16d,"void print_range_(Integer *, Integer *, Integer *, Integer *)");
}

Assistant:

void FATR print_range_(Integer *me, Integer LO[], Integer HI[], Integer *ndim)
{
int hi[GA_MAX_DIM], lo[GA_MAX_DIM];
char msg[100];

    /* GA_MAX_DIM is defined for C and Fortran. Fortran routines should use <=
     * whereas C routines should use < for comparisons. */
    assert((int)*ndim <= GA_MAX_DIM);
    sprintf(msg,"%d: array section ",(int)*me);
    f2c_copy_indices(HI, hi, (int)*ndim);
    f2c_copy_indices(LO, lo, (int)*ndim);
    print_range_internal(msg,(int)*ndim, lo, hi, "\n");
}